

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O1

ustring * __thiscall dlib::tooltip::utext_abi_cxx11_(ustring *__return_storage_ptr__,tooltip *this)

{
  uint *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar2;
  data *pdVar3;
  uint *puVar4;
  uint *puVar5;
  auto_mutex M;
  ustring temp;
  auto_mutex local_58;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_40
  ;
  
  local_58.r = (this->super_mouse_over_event).super_drawable.m;
  local_58.m = (mutex *)0x0;
  local_58.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_58.r,1);
  paVar2 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = 0;
  pdVar3 = (this->stuff)._M_t.
           super___uniq_ptr_impl<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>.
           _M_t.
           super__Tuple_impl<0UL,_dlib::tooltip::data_*,_std::default_delete<dlib::tooltip::data>_>.
           super__Head_base<0UL,_dlib::tooltip::data_*,_false>._M_head_impl;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  if (pdVar3 != (data *)0x0) {
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    _M_assign(&local_40,&(pdVar3->win).text);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_40._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)0x0) {
    puVar5 = (uint *)0x4;
  }
  else {
    puVar4 = local_40._M_dataplus._M_p + -1;
    do {
      puVar5 = puVar4 + 1;
      puVar1 = puVar4 + 1;
      puVar4 = puVar5;
    } while (*puVar1 != 0);
  }
  std::__cxx11::
  basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>::
  _M_construct<unsigned_int_const*>
            ((basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,local_40._M_dataplus._M_p,puVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  auto_mutex::unlock(&local_58);
  return __return_storage_ptr__;
}

Assistant:

const dlib::ustring utext (
        ) const
        {
            auto_mutex M(m);
            dlib::ustring temp;
            if (stuff)
            {
                temp = stuff->win.text;
            }
            return temp.c_str();
        }